

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

void vkt::api::anon_unknown_0::createImageFormatTypeTests
               (TestCaseGroup *testGroup,ImageFormatPropertyCase params)

{
  ImageFormatPropertyCase arg0;
  ImageFormatPropertyCase arg0_00;
  TestContext *pTVar1;
  TestNode *pTVar2;
  TestNode *node;
  ImageFormatPropertyCase local_f0;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  ImageFormatPropertyCase local_88;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  TestNode *local_10;
  TestCaseGroup *testGroup_local;
  
  local_10 = &testGroup->super_TestNode;
  pTVar1 = tcu::TestNode::getTestContext(&testGroup->super_TestNode);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"optimal",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  ImageFormatPropertyCase::ImageFormatPropertyCase
            (&local_88,params.testFunction,VK_FORMAT_UNDEFINED,params.imageType,
             VK_IMAGE_TILING_OPTIMAL);
  arg0.format = local_88.format;
  arg0.imageType = local_88.imageType;
  arg0.testFunction = local_88.testFunction;
  arg0.tiling = local_88.tiling;
  arg0._20_4_ = local_88._20_4_;
  pTVar2 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar1,&local_30,&local_68,createImageFormatTypeTilingTests,arg0)->
            super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pTVar2 = local_10;
  pTVar1 = tcu::TestNode::getTestContext(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"linear",&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
  ImageFormatPropertyCase::ImageFormatPropertyCase
            (&local_f0,params.testFunction,VK_FORMAT_UNDEFINED,params.imageType,
             VK_IMAGE_TILING_LINEAR);
  arg0_00.format = local_f0.format;
  arg0_00.imageType = local_f0.imageType;
  arg0_00.testFunction = local_f0.testFunction;
  arg0_00.tiling = local_f0.tiling;
  arg0_00._20_4_ = local_f0._20_4_;
  node = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                    (pTVar1,&local_a8,&local_d0,createImageFormatTypeTilingTests,arg0_00)->
          super_TestNode;
  tcu::TestNode::addChild(pTVar2,node);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  return;
}

Assistant:

void createImageFormatTypeTests (tcu::TestCaseGroup* testGroup, ImageFormatPropertyCase params)
{
	DE_ASSERT(params.tiling == VK_IMAGE_TILING_LAST);

	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "optimal",	"",	createImageFormatTypeTilingTests, ImageFormatPropertyCase(params.testFunction, VK_FORMAT_UNDEFINED, params.imageType, VK_IMAGE_TILING_OPTIMAL)));
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "linear",	"",	createImageFormatTypeTilingTests, ImageFormatPropertyCase(params.testFunction, VK_FORMAT_UNDEFINED, params.imageType, VK_IMAGE_TILING_LINEAR)));
}